

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_cid.c
# Opt level: O0

void do_mark_pending(quicly_local_cid_set_t *set,size_t idx)

{
  ulong in_RSI;
  long in_RDI;
  size_t j;
  quicly_local_cid_t *in_stack_00000018;
  quicly_local_cid_t *in_stack_00000020;
  ulong local_18;
  
  *(undefined4 *)(in_RDI + 0x10 + in_RSI * 0x38) = 1;
  local_18 = 0;
  while( true ) {
    if (in_RSI <= local_18) {
      return;
    }
    if (*(int *)(in_RDI + 0x10 + local_18 * 0x38) != 1) break;
    local_18 = local_18 + 1;
  }
  swap_cids(in_stack_00000020,in_stack_00000018);
  return;
}

Assistant:

static void do_mark_pending(quicly_local_cid_set_t *set, size_t idx)
{
    set->cids[idx].state = QUICLY_LOCAL_CID_STATE_PENDING;
    for (size_t j = 0; j < idx; j++) {
        if (set->cids[j].state != QUICLY_LOCAL_CID_STATE_PENDING) {
            swap_cids(&set->cids[idx], &set->cids[j]);
            break;
        }
    }
}